

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes ReadSubStreamsInfo(CSzAr *p,CSzData *sd,CSubStreamInfo *ssi)

{
  UInt32 UVar1;
  SRes SVar2;
  UInt32 UVar3;
  int __result___7;
  int __result___6;
  int __result___5;
  int __result___4;
  int __result___3;
  int __result___2;
  int __result___1;
  UInt32 numStreams;
  UInt32 i;
  int __result__;
  UInt32 numUnpackSizesInData;
  UInt32 numUnpackStreams;
  UInt32 numFolders;
  UInt32 numSubDigests;
  UInt64 type;
  CSubStreamInfo *ssi_local;
  CSzData *sd_local;
  CSzAr *p_local;
  
  _numFolders = 0;
  numUnpackStreams = 0;
  __result__ = p->NumFolders;
  i = 0;
  numUnpackSizesInData = __result__;
  type = (UInt64)ssi;
  ssi_local = (CSubStreamInfo *)sd;
  sd_local = (CSzData *)p;
  do {
    while( true ) {
      numStreams = ReadNumber((CSzData *)ssi_local,(UInt64 *)&numFolders);
      UVar1 = numUnpackSizesInData;
      if (numStreams != 0) {
        return numStreams;
      }
      if (_numFolders == 0xd) break;
      if (((_numFolders == 10) || (_numFolders == 9)) || (_numFolders == 0)) {
        if ((*(long *)(type + 8) == 0) &&
           (numUnpackStreams = numUnpackSizesInData, sd_local[1].Data != (Byte *)0x0)) {
          UVar3 = CountDefinedBits(sd_local[1].Data,numUnpackSizesInData);
          numUnpackStreams = UVar1 - UVar3;
        }
        *(int *)type = __result__;
        *(UInt32 *)(type + 4) = numUnpackStreams;
        if (_numFolders == 9) {
          *(undefined8 *)(type + 0x18) = *(undefined8 *)ssi_local;
          SVar2 = SkipNumbers((CSzData *)ssi_local,i);
          if (SVar2 != 0) {
            return SVar2;
          }
          *(long *)(type + 0x20) = *(long *)ssi_local - *(long *)(type + 0x18);
          SVar2 = ReadNumber((CSzData *)ssi_local,(UInt64 *)&numFolders);
          if (SVar2 != 0) {
            return SVar2;
          }
        }
        do {
          if (_numFolders == 0) {
            return 0;
          }
          if (_numFolders == 10) {
            *(undefined8 *)(type + 0x28) = *(undefined8 *)ssi_local;
            SVar2 = SkipBitUi32s((CSzData *)ssi_local,numUnpackStreams);
            if (SVar2 != 0) {
              return SVar2;
            }
            *(long *)(type + 0x30) = *(long *)ssi_local - *(long *)(type + 0x28);
          }
          else {
            SVar2 = SkipData((CSzData *)ssi_local);
            if (SVar2 != 0) {
              return SVar2;
            }
          }
          SVar2 = ReadNumber((CSzData *)ssi_local,(UInt64 *)&numFolders);
        } while (SVar2 == 0);
        return SVar2;
      }
      SVar2 = SkipData((CSzData *)ssi_local);
      if (SVar2 != 0) {
        return SVar2;
      }
    }
    *(undefined8 *)(type + 8) = *(undefined8 *)ssi_local;
    __result__ = 0;
    numUnpackStreams = 0;
    for (__result___1 = 0; (uint)__result___1 < numUnpackSizesInData;
        __result___1 = __result___1 + 1) {
      SVar2 = SzReadNumber32((CSzData *)ssi_local,(UInt32 *)&__result___2);
      if (SVar2 != 0) {
        return SVar2;
      }
      if ((uint)(__result__ + __result___2) < (uint)__result__) {
        return 4;
      }
      __result__ = __result___2 + __result__;
      if (__result___2 != 0) {
        i = __result___2 + -1 + i;
      }
      if (((__result___2 != 1) || (sd_local[1].Data == (Byte *)0x0)) ||
         (((uint)sd_local[1].Data[(uint)__result___1 >> 3] & 0x80 >> ((byte)__result___1 & 7)) == 0)
         ) {
        numUnpackStreams = __result___2 + numUnpackStreams;
      }
    }
    *(long *)(type + 0x10) = *(long *)ssi_local - *(long *)(type + 8);
  } while( true );
}

Assistant:

static SRes ReadSubStreamsInfo(CSzAr *p, CSzData *sd, CSubStreamInfo *ssi)
{
  UInt64 type = 0;
  UInt32 numSubDigests = 0;
  UInt32 numFolders = p->NumFolders;
  UInt32 numUnpackStreams = numFolders;
  UInt32 numUnpackSizesInData = 0;

  for (;;)
  {
    RINOK(ReadID(sd, &type));
    if (type == k7zIdNumUnpackStream)
    {
      UInt32 i;
      ssi->sdNumSubStreams.Data = sd->Data;
      numUnpackStreams = 0;
      numSubDigests = 0;
      for (i = 0; i < numFolders; i++)
      {
        UInt32 numStreams;
        RINOK(SzReadNumber32(sd, &numStreams));
        if (numUnpackStreams > numUnpackStreams + numStreams)
          return SZ_ERROR_UNSUPPORTED;
        numUnpackStreams += numStreams;
        if (numStreams != 0)
          numUnpackSizesInData += (numStreams - 1);
        if (numStreams != 1 || !SzBitWithVals_Check(&p->FolderCRCs, i))
          numSubDigests += numStreams;
      }
      ssi->sdNumSubStreams.Size = sd->Data - ssi->sdNumSubStreams.Data;
      continue;
    }
    if (type == k7zIdCRC || type == k7zIdSize || type == k7zIdEnd)
      break;
    RINOK(SkipData(sd));
  }

  if (!ssi->sdNumSubStreams.Data)
  {
    numSubDigests = numFolders;
    if (p->FolderCRCs.Defs)
      numSubDigests = numFolders - CountDefinedBits(p->FolderCRCs.Defs, numFolders);
  }
  
  ssi->NumTotalSubStreams = numUnpackStreams;
  ssi->NumSubDigests = numSubDigests;

  if (type == k7zIdSize)
  {
    ssi->sdSizes.Data = sd->Data;
    RINOK(SkipNumbers(sd, numUnpackSizesInData));
    ssi->sdSizes.Size = sd->Data - ssi->sdSizes.Data;
    RINOK(ReadID(sd, &type));
  }

  for (;;)
  {
    if (type == k7zIdEnd)
      return SZ_OK;
    if (type == k7zIdCRC)
    {
      ssi->sdCRCs.Data = sd->Data;
      RINOK(SkipBitUi32s(sd, numSubDigests));
      ssi->sdCRCs.Size = sd->Data - ssi->sdCRCs.Data;
    }
    else
    {
      RINOK(SkipData(sd));
    }
    RINOK(ReadID(sd, &type));
  }
}